

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoAttribute
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  Attribute Attr;
  DWARFObject *pDVar1;
  ulong uVar2;
  bool bVar3;
  Tag TVar4;
  Tag TVar5;
  int iVar6;
  unsigned_long *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArrayRef<unsigned_char> *pAVar8;
  DWARFDebugLoc *this_00;
  LocationList *pLVar9;
  char *Str;
  Entry *Entry;
  void *pvVar10;
  long lVar11;
  Optional<unsigned_long> OVar12;
  ArrayRef<unsigned_char> D;
  Twine local_1a0;
  StringRef local_188;
  StringRef local_178;
  StringRef local_168;
  Twine local_158;
  Twine local_140;
  Child local_128;
  anon_class_24_3_3ca02edf VerifyLocationExpr;
  Twine local_d8;
  undefined1 local_c0 [8];
  DWARFDie ReferencedDie;
  DWARFDie TypeDie;
  Child local_98;
  Optional<unsigned_long> SectionOffset_1;
  Child local_80;
  Optional<unsigned_long> LocOffset;
  undefined1 local_68 [8];
  Optional<unsigned_long> SectionOffset;
  undefined1 local_50 [8];
  anon_class_24_3_98b65f3c ReportError;
  uint NumErrors;
  
  local_50 = (undefined1  [8])((long)&ReportError.Die + 4);
  ReportError.Die._4_4_ = 0;
  Attr = AttrValue->Attr;
  ReportError.NumErrors = (uint *)this;
  ReportError.this = (DWARFVerifier *)Die;
  if (Attr == DW_AT_location) {
    VerifyLocationExpr.this = (DWARFVerifier *)local_50;
    local_128 = (Child)Die;
    VerifyLocationExpr.Die = (DWARFDie *)this;
    DWARFFormValue::getAsBlock
              ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_68,&AttrValue->Value);
    if (SectionOffset.Storage.hasVal == true) {
      pAVar8 = optional_detail::OptionalStorage<llvm::ArrayRef<unsigned_char>,_true>::getValue
                         ((OptionalStorage<llvm::ArrayRef<unsigned_char>,_true> *)local_68);
      verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                ((anon_class_24_3_3ca02edf *)&local_128,*pAVar8);
      return ReportError.Die._4_4_;
    }
    OVar12 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_80 = (Child)OVar12.Storage.field_0;
    LocOffset.Storage.field_0.empty = OVar12.Storage.hasVal;
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return ReportError.Die._4_4_;
    }
    this_00 = DWARFContext::getDebugLoc(this->DCtx);
    if (this_00 == (DWARFDebugLoc *)0x0) {
      return ReportError.Die._4_4_;
    }
    puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_80);
    pLVar9 = DWARFDebugLoc::getLocationListAtOffset(this_00,*puVar7);
    if (pLVar9 == (LocationList *)0x0) {
      return ReportError.Die._4_4_;
    }
    pvVar10 = (pLVar9->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
              super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.BeginX;
    for (lVar11 = (ulong)(pLVar9->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                         super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                         super_SmallVectorBase.Size * 0x28; lVar11 != 0; lVar11 = lVar11 + -0x28) {
      D.Length._4_4_ = 0;
      D._0_12_ = *(undefined1 (*) [12])((long)pvVar10 + 0x10);
      verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                ((anon_class_24_3_3ca02edf *)&local_128,D);
      pvVar10 = (void *)((long)pvVar10 + 0x28);
    }
    return ReportError.Die._4_4_;
  }
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  if (Attr == DW_AT_stmt_list) {
    OVar12 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_98 = (Child)OVar12.Storage.field_0;
    SectionOffset_1.Storage.field_0.empty = OVar12.Storage.hasVal;
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_98);
      uVar2 = *puVar7;
      iVar6 = (*pDVar1->_vptr_DWARFObject[0xf])(pDVar1);
      if (uVar2 < *(ulong *)(CONCAT44(extraout_var_00,iVar6) + 8)) {
        return ReportError.Die._4_4_;
      }
      Twine::Twine((Twine *)&local_80,"DW_AT_stmt_list offset is beyond .debug_line bounds: ");
      puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_98);
      formatv<unsigned_long_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                  *)&local_128,"{0:x8}",puVar7);
      Twine::Twine(&local_d8,(formatv_object_base *)&local_128);
      Twine::concat((Twine *)local_68,(Twine *)&local_80,&local_d8);
      verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                ((anon_class_24_3_98b65f3c *)local_50,(Twine *)local_68);
      formatv_object_base::~formatv_object_base((formatv_object_base *)&local_128);
      return ReportError.Die._4_4_;
    }
    Str = "DIE has invalid DW_AT_stmt_list encoding:";
  }
  else {
    if ((Attr == DW_AT_abstract_origin) || (Attr == DW_AT_specification)) {
      _local_c0 = DWARFDie::getAttributeValueAsReferencedDie(Die,Attr);
      if (local_c0._8_8_ == (DWARFDebugInfoEntry *)0x0 || local_c0 == (DWARFUnit *)0x0) {
        return ReportError.Die._4_4_;
      }
      TVar5 = DWARFDie::getTag(Die);
      TVar4 = DWARFDie::getTag((DWARFDie *)local_c0);
      if (TVar5 == TVar4) {
        return ReportError.Die._4_4_;
      }
      if ((TVar4 ^ DW_TAG_subprogram) == DW_TAG_null && TVar5 == DW_TAG_inlined_subroutine) {
        return ReportError.Die._4_4_;
      }
      if (TVar4 == DW_TAG_member && TVar5 == DW_TAG_variable) {
        return ReportError.Die._4_4_;
      }
      if (TVar5 == DW_TAG_GNU_call_site && (TVar4 ^ DW_TAG_subprogram) == DW_TAG_null) {
        return ReportError.Die._4_4_;
      }
      local_188 = dwarf::TagString((uint)TVar5);
      Twine::Twine((Twine *)&local_98,"DIE with tag ",&local_188);
      Twine::Twine((Twine *)&ReferencedDie.Die," has ");
      Twine::concat(&local_d8,(Twine *)&local_98,(Twine *)&ReferencedDie.Die);
      local_178 = dwarf::AttributeString((uint)Attr);
      Twine::Twine(&local_158,&local_178);
      Twine::concat((Twine *)&local_80,&local_d8,&local_158);
      Twine::Twine(&local_140," that points to DIE with incompatible tag ");
      Twine::concat((Twine *)local_68,(Twine *)&local_80,&local_140);
      local_168 = dwarf::TagString((uint)TVar4);
      Twine::Twine(&local_1a0,&local_168);
      Twine::concat((Twine *)&local_128,(Twine *)local_68,&local_1a0);
      goto LAB_00b4b26b;
    }
    if (Attr == DW_AT_type) {
      join_0x00000010_0x00000000_ = DWARFDie::getAttributeValueAsReferencedDie(Die,DW_AT_type);
      if (ReferencedDie._16_8_ == (DWARFDebugInfoEntry *)0x0 ||
          ReferencedDie.Die == (DWARFUnit *)0x0) {
        return ReportError.Die._4_4_;
      }
      TVar5 = DWARFDie::getTag((DWARFDie *)&ReferencedDie.Die);
      bVar3 = dwarf::isType(TVar5);
      if (bVar3) {
        return ReportError.Die._4_4_;
      }
      local_158._0_16_ = dwarf::AttributeString(0x49);
      Twine::Twine((Twine *)&local_80,"DIE has ",(StringRef *)&local_158);
      Twine::Twine(&local_d8," with incompatible tag ");
      Twine::concat((Twine *)local_68,(Twine *)&local_80,&local_d8);
      TVar5 = DWARFDie::getTag((DWARFDie *)&ReferencedDie.Die);
      local_140._0_16_ = dwarf::TagString((uint)TVar5);
      Twine::Twine((Twine *)&local_98,(StringRef *)&local_140);
      Twine::concat((Twine *)&local_128,(Twine *)local_68,(Twine *)&local_98);
      goto LAB_00b4b26b;
    }
    if (Attr != DW_AT_ranges) {
      return 0;
    }
    OVar12 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    local_68 = (undefined1  [8])OVar12.Storage.field_0;
    SectionOffset.Storage.field_0.empty = OVar12.Storage.hasVal;
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      Str = "DIE has invalid DW_AT_ranges encoding:";
    }
    else {
      puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)local_68);
      uVar2 = *puVar7;
      iVar6 = (*pDVar1->_vptr_DWARFObject[0x12])(pDVar1);
      if (uVar2 < *(ulong *)(CONCAT44(extraout_var,iVar6) + 8)) {
        return ReportError.Die._4_4_;
      }
      Str = "DW_AT_ranges offset is beyond .debug_ranges bounds:";
    }
  }
  Twine::Twine((Twine *)&local_128,Str);
LAB_00b4b26b:
  verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
            ((anon_class_24_3_98b65f3c *)local_50,(Twine *)&local_128);
  return ReportError.Die._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoAttribute(const DWARFDie &Die,
                                                 DWARFAttribute &AttrValue) {
  unsigned NumErrors = 0;
  auto ReportError = [&](const Twine &TitleMsg) {
    ++NumErrors;
    error() << TitleMsg << '\n';
    dump(Die) << '\n';
  };

  const DWARFObject &DObj = DCtx.getDWARFObj();
  const auto Attr = AttrValue.Attr;
  switch (Attr) {
  case DW_AT_ranges:
    // Make sure the offset in the DW_AT_ranges attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getRangesSection().Data.size())
        ReportError("DW_AT_ranges offset is beyond .debug_ranges bounds:");
      break;
    }
    ReportError("DIE has invalid DW_AT_ranges encoding:");
    break;
  case DW_AT_stmt_list:
    // Make sure the offset in the DW_AT_stmt_list attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getLineSection().Data.size())
        ReportError("DW_AT_stmt_list offset is beyond .debug_line bounds: " +
                    llvm::formatv("{0:x8}", *SectionOffset));
      break;
    }
    ReportError("DIE has invalid DW_AT_stmt_list encoding:");
    break;
  case DW_AT_location: {
    auto VerifyLocationExpr = [&](ArrayRef<uint8_t> D) {
      DWARFUnit *U = Die.getDwarfUnit();
      DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), 0);
      DWARFExpression Expression(Data, U->getVersion(),
                                 U->getAddressByteSize());
      bool Error = llvm::any_of(Expression, [](DWARFExpression::Operation &Op) {
        return Op.isError();
      });
      if (Error || !Expression.verify(U))
        ReportError("DIE contains invalid DWARF expression:");
    };
    if (Optional<ArrayRef<uint8_t>> Expr = AttrValue.Value.getAsBlock()) {
      // Verify inlined location.
      VerifyLocationExpr(*Expr);
    } else if (auto LocOffset = AttrValue.Value.getAsSectionOffset()) {
      // Verify location list.
      if (auto DebugLoc = DCtx.getDebugLoc())
        if (auto LocList = DebugLoc->getLocationListAtOffset(*LocOffset))
          for (const auto &Entry : LocList->Entries)
            VerifyLocationExpr(Entry.Loc);
    }
    break;
  }
  case DW_AT_specification:
  case DW_AT_abstract_origin: {
    if (auto ReferencedDie = Die.getAttributeValueAsReferencedDie(Attr)) {
      auto DieTag = Die.getTag();
      auto RefTag = ReferencedDie.getTag();
      if (DieTag == RefTag)
        break;
      if (DieTag == DW_TAG_inlined_subroutine && RefTag == DW_TAG_subprogram)
        break;
      if (DieTag == DW_TAG_variable && RefTag == DW_TAG_member)
        break;
      // This might be reference to a function declaration.
      if (DieTag == DW_TAG_GNU_call_site && RefTag == DW_TAG_subprogram)
        break;
      ReportError("DIE with tag " + TagString(DieTag) + " has " +
                  AttributeString(Attr) +
                  " that points to DIE with "
                  "incompatible tag " +
                  TagString(RefTag));
    }
    break;
  }
  case DW_AT_type: {
    DWARFDie TypeDie = Die.getAttributeValueAsReferencedDie(DW_AT_type);
    if (TypeDie && !isType(TypeDie.getTag())) {
      ReportError("DIE has " + AttributeString(Attr) +
                  " with incompatible tag " + TagString(TypeDie.getTag()));
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}